

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHDiv.cpp
# Opt level: O1

void TPZShapeHDiv<pzshape::TPZShapePiram>::ComputeMasterDirections(TPZShapeData *data)

{
  long lVar1;
  double *pdVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  int i;
  long lVar7;
  long lVar8;
  int il;
  long lVar9;
  int side;
  TPZFNMatrix<9,_double> gradx;
  TPZFMatrix<double> local_110;
  double local_80 [10];
  
  TPZFMatrix<double>::Resize(&(data->fMasterDirections).super_TPZFMatrix<double>,3,0x39);
  local_110.fElem = local_80;
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 3;
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0183dbe0;
  local_110.fSize = 9;
  local_110.fGiven = local_110.fElem;
  TPZVec<int>::TPZVec(&local_110.fPivot.super_TPZVec<int>,0);
  local_110.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_110.fPivot.super_TPZVec<int>.fStore = local_110.fPivot.fExtAlloc;
  local_110.fPivot.super_TPZVec<int>.fNElements = 0;
  local_110.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_110.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_110.fWork.fStore = (double *)0x0;
  local_110.fWork.fNElements = 0;
  local_110.fWork.fNAlloc = 0;
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_0183d8f0;
  TPZFMatrix<double>::operator=(&local_110,0.0);
  lVar7 = 0;
  do {
    if ((local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar7) ||
       (local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar7)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_110.fElem[local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar7 + lVar7] =
         1.0;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  pztopology::TPZPyramid::ComputeHDivDirections<double>
            (&local_110,&(data->fMasterDirections).super_TPZFMatrix<double>);
  iVar4 = 0;
  lVar7 = 0xd;
  do {
    uVar3 = pztopology::TPZPyramid::NContainedSides((int)lVar7);
    if (0 < (int)uVar3) {
      lVar8 = (long)iVar4 * 8;
      uVar6 = 0;
      do {
        lVar1 = uVar6 + (long)iVar4;
        lVar9 = 0;
        do {
          if ((((data->fMasterDirections).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                super_TPZBaseMatrix.fRow <= lVar9) || (lVar1 < 0)) ||
             ((data->fMasterDirections).super_TPZFMatrix<double>.super_TPZMatrix<double>.
              super_TPZBaseMatrix.fCol <= lVar1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar5 = (data->fMasterDirections).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                  super_TPZBaseMatrix.fRow * lVar8;
          pdVar2 = (data->fMasterDirections).super_TPZFMatrix<double>.fElem;
          *(double *)((long)pdVar2 + lVar9 * 8 + lVar5) =
               (double)(data->fSideOrient).super_TPZVec<int>.fStore[lVar7 + -0xd] *
               *(double *)((long)pdVar2 + lVar9 * 8 + lVar5);
          lVar9 = lVar9 + 1;
        } while (lVar9 != 3);
        uVar6 = uVar6 + 1;
        lVar8 = lVar8 + 8;
      } while (uVar6 != uVar3);
    }
    iVar4 = iVar4 + uVar3;
    lVar7 = lVar7 + 1;
    if (lVar7 == 0x12) {
      TPZFMatrix<double>::~TPZFMatrix(&local_110,&PTR_PTR_0183dba8);
      return;
    }
  } while( true );
}

Assistant:

void TPZShapeHDiv<TSHAPE>::ComputeMasterDirections(TPZShapeData &data)
{
    int64_t numvec = TSHAPE::Dimension*TSHAPE::NSides;
    const int dim = TSHAPE::Dimension;
    data.fMasterDirections.Resize(3,numvec);
    TPZFNMatrix<9,REAL> gradx(3,TSHAPE::Dimension,0.);
    for (int i = 0; i < TSHAPE::Dimension; i++) {
        gradx(i,i) = 1.;
    }
    TSHAPE::ComputeHDivDirections(gradx, data.fMasterDirections);
    
    int firstface = TSHAPE::NSides - TSHAPE::NFacets - 1;
    int lastface = TSHAPE::NSides - 1;
    int cont = 0;
    for(int side = firstface; side < lastface; side++)
    {
        int nvec = TSHAPE::NContainedSides(side);
        for (int ivet = 0; ivet<nvec; ivet++)
        {
            for (int il = 0; il<dim; il++)
            {
              data.fMasterDirections(il,ivet+cont) *= data.fSideOrient[side-firstface];
            }
        }
        cont += nvec;
    }
    
}